

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O0

int search_filter_level(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,int partial_frame,
                       int *last_frame_filter_level,int plane,int dir,int64_t *best_filter_sse)

{
  int iVar1;
  int high;
  int iVar2;
  int64_t iVar3;
  int *in_RCX;
  AV1_COMP *in_RSI;
  int in_R8D;
  uint in_R9D;
  int64_t *in_stack_00000008;
  int64_t bias;
  int filt_low;
  int filt_high;
  int min_filter_step_thesh;
  int use_coarse_search;
  int64_t ss_err [64];
  int filter_step;
  int filt_mid;
  int lvl;
  int filt_best;
  int64_t best_err;
  int filt_direction;
  int max_filter_level;
  int min_filter_level;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_fffffffffffffd58;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffd60;
  int local_294;
  int local_290;
  int local_28c;
  long local_280;
  int64_t local_268;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  AV1_COMP *in_stack_fffffffffffffdb0;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffdb8;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  int local_44;
  
  high = get_max_filter_level(in_stack_fffffffffffffd58);
  local_44 = 0;
  if (in_R8D == 0) {
    if (in_R9D < 2) {
      local_58 = in_RCX[(int)in_R9D];
    }
    else {
      if (in_R9D != 2) {
        return 0;
      }
      local_58 = *in_RCX + in_RCX[1] + 1 >> 1;
    }
  }
  else if (in_R8D == 1) {
    local_58 = in_RCX[2];
  }
  else {
    if (in_R8D != 2) {
      return 0;
    }
    local_58 = in_RCX[3];
  }
  local_5c = clamp(local_58,0,high);
  if (local_5c < 0x10) {
    local_28c = 4;
  }
  else {
    local_28c = local_5c / 4;
  }
  local_60 = local_28c;
  iVar1 = search_filter_level::min_filter_step_lookup
          [(in_RSI->sf).lpf_sf.use_coarse_filter_level_search];
  memset(&local_268,0xff,0x200);
  yv12_copy_plane(in_stack_fffffffffffffd60,(YV12_BUFFER_CONFIG *)in_stack_fffffffffffffd58,0);
  local_50 = try_filter_frame(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                              in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
                              in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
  (&local_268)[local_5c] = local_50;
  local_54 = local_5c;
  while (iVar1 < local_60) {
    local_290 = high;
    if (local_5c + local_60 < high) {
      local_290 = local_5c + local_60;
    }
    if (local_5c - local_60 < 1) {
      local_294 = 0;
    }
    else {
      local_294 = local_5c - local_60;
    }
    local_280 = (local_50 >> (0xfU - (char)(local_5c / 8) & 0x3f)) * (long)local_60;
    iVar2 = is_stat_consumption_stage_twopass(in_RSI);
    if ((iVar2 != 0) && ((in_RSI->ppi->twopass).section_intra_rating < 0x14)) {
      local_280 = (long)(local_280 * (ulong)(in_RSI->ppi->twopass).section_intra_rating) / 0x14;
    }
    if ((in_RSI->common).features.tx_mode != '\0') {
      local_280 = local_280 >> 1;
    }
    if ((local_44 < 1) && (local_294 != local_5c)) {
      if ((&local_268)[local_294] < 0) {
        iVar3 = try_filter_frame(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                                 in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
                                 in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
        (&local_268)[local_294] = iVar3;
      }
      if ((&local_268)[local_294] < local_50 + local_280) {
        if ((&local_268)[local_294] < local_50) {
          local_50 = (&local_268)[local_294];
        }
        local_54 = local_294;
      }
    }
    if ((-1 < local_44) && (local_290 != local_5c)) {
      if ((&local_268)[local_290] < 0) {
        iVar3 = try_filter_frame(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                                 in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
                                 in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
        (&local_268)[local_290] = iVar3;
      }
      if ((&local_268)[local_290] < local_50 - local_280) {
        local_50 = (&local_268)[local_290];
        local_54 = local_290;
      }
    }
    if (local_54 == local_5c) {
      local_60 = local_60 / 2;
      local_44 = 0;
    }
    else {
      local_44 = 1;
      if (local_54 < local_5c) {
        local_44 = -1;
      }
      local_5c = local_54;
    }
  }
  *in_stack_00000008 = (&local_268)[local_54];
  return local_54;
}

Assistant:

static int search_filter_level(const YV12_BUFFER_CONFIG *sd, AV1_COMP *cpi,
                               int partial_frame,
                               const int *last_frame_filter_level, int plane,
                               int dir, int64_t *best_filter_sse) {
  const AV1_COMMON *const cm = &cpi->common;
  const int min_filter_level = 0;
  const int max_filter_level = get_max_filter_level(cpi);
  int filt_direction = 0;
  int64_t best_err;
  int filt_best;

  // Start the search at the previous frame filter level unless it is now out of
  // range.
  int lvl;
  switch (plane) {
    case 0:
      switch (dir) {
        case 2:
          lvl = (last_frame_filter_level[0] + last_frame_filter_level[1] + 1) >>
                1;
          break;
        case 0:
        case 1: lvl = last_frame_filter_level[dir]; break;
        default: assert(dir >= 0 && dir <= 2); return 0;
      }
      break;
    case 1: lvl = last_frame_filter_level[2]; break;
    case 2: lvl = last_frame_filter_level[3]; break;
    default: assert(plane >= 0 && plane <= 2); return 0;
  }
  int filt_mid = clamp(lvl, min_filter_level, max_filter_level);
  int filter_step = filt_mid < 16 ? 4 : filt_mid / 4;
  // Sum squared error at each filter level
  int64_t ss_err[MAX_LOOP_FILTER + 1];

  const int use_coarse_search = cpi->sf.lpf_sf.use_coarse_filter_level_search;
  assert(use_coarse_search <= 1);
  static const int min_filter_step_lookup[2] = { 0, 2 };
  // min_filter_step_thesh determines the stopping criteria for the search.
  // The search is terminated when filter_step equals min_filter_step_thesh.
  const int min_filter_step_thesh = min_filter_step_lookup[use_coarse_search];

  // Set each entry to -1
  memset(ss_err, 0xFF, sizeof(ss_err));
  yv12_copy_plane(&cm->cur_frame->buf, &cpi->last_frame_uf, plane);
  best_err = try_filter_frame(sd, cpi, filt_mid, partial_frame, plane, dir);
  filt_best = filt_mid;
  ss_err[filt_mid] = best_err;

  while (filter_step > min_filter_step_thesh) {
    const int filt_high = AOMMIN(filt_mid + filter_step, max_filter_level);
    const int filt_low = AOMMAX(filt_mid - filter_step, min_filter_level);

    // Bias against raising loop filter in favor of lowering it.
    int64_t bias = (best_err >> (15 - (filt_mid / 8))) * filter_step;

    if ((is_stat_consumption_stage_twopass(cpi)) &&
        (cpi->ppi->twopass.section_intra_rating < 20))
      bias = (bias * cpi->ppi->twopass.section_intra_rating) / 20;

    // yx, bias less for large block size
    if (cm->features.tx_mode != ONLY_4X4) bias >>= 1;

    if (filt_direction <= 0 && filt_low != filt_mid) {
      // Get Low filter error score
      if (ss_err[filt_low] < 0) {
        ss_err[filt_low] =
            try_filter_frame(sd, cpi, filt_low, partial_frame, plane, dir);
      }
      // If value is close to the best so far then bias towards a lower loop
      // filter value.
      if (ss_err[filt_low] < (best_err + bias)) {
        // Was it actually better than the previous best?
        if (ss_err[filt_low] < best_err) {
          best_err = ss_err[filt_low];
        }
        filt_best = filt_low;
      }
    }

    // Now look at filt_high
    if (filt_direction >= 0 && filt_high != filt_mid) {
      if (ss_err[filt_high] < 0) {
        ss_err[filt_high] =
            try_filter_frame(sd, cpi, filt_high, partial_frame, plane, dir);
      }
      // If value is significantly better than previous best, bias added against
      // raising filter value
      if (ss_err[filt_high] < (best_err - bias)) {
        best_err = ss_err[filt_high];
        filt_best = filt_high;
      }
    }

    // Half the step distance if the best filter value was the same as last time
    if (filt_best == filt_mid) {
      filter_step /= 2;
      filt_direction = 0;
    } else {
      filt_direction = (filt_best < filt_mid) ? -1 : 1;
      filt_mid = filt_best;
    }
  }

  *best_filter_sse = ss_err[filt_best];

  return filt_best;
}